

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O1

bool __thiscall
llvm::cl::opt<int,_false,_llvm::cl::parser<int>_>::handleOccurrence
          (opt<int,_false,_llvm::cl::parser<int>_> *this,uint pos,StringRef ArgName,StringRef Arg)

{
  bool bVar1;
  parser_data_type_conflict Val;
  int local_14;
  
  local_14 = 0;
  bVar1 = parser<int>::parse((parser<int> *)this,&this->super_Option,ArgName,Arg,&local_14);
  if (!bVar1) {
    *(int *)&this->super_opt_storage<int,_false,_false> = local_14;
    (this->super_Option).Position = pos;
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }